

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

type chaiscript::Boxed_Number::go<signed_char,float>
               (Opers t_oper,Boxed_Value *t_lhs,Boxed_Value *t_rhs)

{
  bool bVar1;
  undefined8 uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  int in_ESI;
  element_type *in_RDI;
  float fVar4;
  float fVar5;
  Boxed_Value BVar6;
  type tVar7;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  element_type *peVar8;
  undefined4 in_stack_ffffffffffffffc8;
  Opers in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd4;
  Opers in_stack_ffffffffffffffdc;
  
  peVar8 = in_RDI;
  if ((in_ESI < 1) || (6 < in_ESI)) {
    if ((7 < in_ESI) && (in_ESI < 0xf)) {
      bVar1 = Boxed_Value::is_const((Boxed_Value *)0x1e7a6f);
      if (!bVar1) {
        bVar1 = Boxed_Value::is_return_value((Boxed_Value *)0x1e7a7d);
        if (!bVar1) {
          Boxed_Value::get_ptr((Boxed_Value *)0x1e7a93);
          get_as_aux<float,float>((Boxed_Value *)0x1e7aa2);
          BVar6 = binary_go<signed_char,float>
                            (in_stack_ffffffffffffffcc,(char *)peVar8,(float *)in_RDI,
                             (Boxed_Value *)
                             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
          _Var3._M_pi = BVar6.m_data.
                        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
          goto LAB_001e7b3d;
        }
      }
    }
    if (in_ESI < 0x1f) {
      uVar2 = __cxa_allocate_exception(0x28);
      chaiscript::detail::exception::bad_any_cast::bad_any_cast
                ((bad_any_cast *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      __cxa_throw(uVar2,&chaiscript::detail::exception::bad_any_cast::typeinfo,
                  chaiscript::detail::exception::bad_any_cast::~bad_any_cast);
    }
    fVar4 = get_as_aux<float,signed_char>((Boxed_Value *)0x1e7ae0);
    fVar5 = get_as_aux<float,float>((Boxed_Value *)0x1e7af0);
    BVar6 = const_binary_go<float>
                      (in_stack_ffffffffffffffdc,(float *)CONCAT44(in_stack_ffffffffffffffd4,fVar4),
                       (float *)CONCAT44(fVar5,in_stack_ffffffffffffffc8));
    _Var3._M_pi = BVar6.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  else {
    get_as_aux<float,signed_char>((Boxed_Value *)0x1e7a24);
    get_as_aux<float,float>((Boxed_Value *)0x1e7a34);
    BVar6 = boolean_go<float>(in_stack_ffffffffffffffcc,(float *)peVar8,(float *)in_RDI);
    _Var3._M_pi = BVar6.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
LAB_001e7b3d:
  tVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  tVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar8;
  return (type)tVar7.m_data.
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto go(Operators::Opers t_oper, const Boxed_Value &t_lhs, const Boxed_Value &t_rhs) 
          -> typename std::enable_if<std::is_floating_point<LHS>::value || std::is_floating_point<RHS>::value, Boxed_Value>::type
      {
        typedef typename std::common_type<LHS, RHS>::type common_type;
        if (t_oper > Operators::boolean_flag && t_oper < Operators::non_const_flag)
        {
          return boolean_go(t_oper, get_as_aux<common_type, LHS>(t_lhs), get_as_aux<common_type, RHS>(t_rhs));
        } else if (t_oper > Operators::non_const_flag && t_oper < Operators::non_const_int_flag && !t_lhs.is_const() && !t_lhs.is_return_value()) {
          return binary_go(t_oper, *static_cast<LHS *>(t_lhs.get_ptr()), get_as_aux<common_type, RHS>(t_rhs), t_lhs);
        } else if (t_oper > Operators::const_flag) {
          return const_binary_go(t_oper, get_as_aux<common_type, LHS>(t_lhs), get_as_aux<common_type, RHS>(t_rhs));
        } else {
          throw chaiscript::detail::exception::bad_any_cast();
        }
      }